

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

int CVmObjList::getp_insert_at(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  int iVar1;
  uint argc;
  
  if (in_argc == (uint *)0x0) {
    argc = 0xffffffff;
  }
  else {
    argc = *in_argc - 1;
  }
  if (getp_insert_at(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_insert_at();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_insert_at::desc);
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 < 1) {
      iVar1 = iVar1 + (uint)*(ushort *)lst + 1;
    }
    insert_elements(retval,self_val,lst,argc,iVar1 + -1);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_insert_at(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *lst, uint *in_argc)
{
    /* check arguments - we need at least two */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the index value; adjust negative values */
    int idx = CVmBif::pop_int_val(vmg0_);
    if (idx <= 0)
        idx += vmb_get_len(lst) + 1;

    /* adjust to zero-based indexing */
    idx -= 1;

    /* 
     *   Insert the element (there's just one) at the start of the list.
     *   Note that we must decrement the argument count we got, since we
     *   already took off the first argument (the index value). 
     */
    insert_elements(vmg_ retval, self_val, lst, argc - 1, idx);

    /* handled */
    return TRUE;
}